

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

IdMap * __thiscall
libcellml::Validator::ValidatorImpl::buildModelIdMap_abi_cxx11_
          (IdMap *__return_storage_ptr__,ValidatorImpl *this,ModelPtr *model)

{
  _Rb_tree_header *p_Var1;
  size_type *psVar2;
  _func_int **pp_Var3;
  IssueImpl *this_00;
  bool bVar4;
  long *plVar5;
  size_t sVar6;
  undefined8 *puVar7;
  Entity *pEVar8;
  ulong *puVar9;
  long *plVar10;
  ulong *puVar11;
  element_type *peVar12;
  ulong uVar13;
  ValidatorImpl *pVVar14;
  undefined8 uVar15;
  _Alloc_hider this_01;
  ValidatorImpl *this_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  string reference;
  string prefix;
  string id;
  UnitsPtr units;
  string info;
  IssuePtr issue;
  double multiplier;
  double exponent;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reportedConnections;
  undefined1 local_1e0 [32];
  string local_1c0;
  string local_1a0;
  Validator *local_180;
  string local_178;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  string local_138;
  IdMap *local_118;
  undefined1 local_110 [16];
  undefined1 local_100 [17];
  undefined7 uStack_ef;
  IssuePtr local_e0;
  element_type local_d0;
  string local_c0;
  ValidatorImpl *local_a0;
  ulong local_98;
  string local_90;
  double local_70;
  double local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_100._0_8_ = local_100 + 0x10;
  local_100._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_100[0x10] = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_180 = (Validator *)model;
  local_118 = __return_storage_ptr__;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  Entity::id_abi_cxx11_
            ((string *)local_1e0,
             (Entity *)
             (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  uVar15 = local_1e0._8_8_;
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  puVar11 = (ulong *)(local_1e0 + 0x10);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar15 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    NamedEntity::name_abi_cxx11_
              (&local_1a0,
               (NamedEntity *)
               ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
               &local_180->super_Logger)->_M_ptr);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x2a9328);
    pEVar8 = (Entity *)(plVar5 + 2);
    if ((Entity *)*plVar5 == pEVar8) {
      local_1c0.field_2._M_allocated_capacity = (size_type)pEVar8->_vptr_Entity;
      local_1c0.field_2._8_8_ = plVar5[3];
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    }
    else {
      local_1c0.field_2._M_allocated_capacity = (size_type)pEVar8->_vptr_Entity;
      local_1c0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_1c0._M_string_length = plVar5[1];
    *plVar5 = (long)pEVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_1c0);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_1e0._16_8_ = *puVar9;
      local_1e0._24_8_ = plVar5[3];
      local_1e0._0_8_ = puVar11;
    }
    else {
      local_1e0._16_8_ = *puVar9;
      local_1e0._0_8_ = (ulong *)*plVar5;
    }
    local_1e0._8_8_ = plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)(local_110 + 0x10),(string *)local_1e0);
    if ((ulong *)local_1e0._0_8_ != puVar11) {
      operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    pVVar14 = (ValidatorImpl *)local_1e0;
    Entity::id_abi_cxx11_
              ((string *)pVVar14,
               (Entity *)
               ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
               &local_180->super_Logger)->_M_ptr);
    addIdMapItem(pVVar14,(string *)local_1e0,(string *)(local_110 + 0x10),local_118);
    if ((ulong *)local_1e0._0_8_ != puVar11) {
      operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
    }
  }
  uVar13 = 0;
  local_a0 = this;
  while( true ) {
    paVar16 = &local_178.field_2;
    sVar6 = Model::unitsCount(((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                              &local_180->super_Logger)->_M_ptr);
    if (sVar6 <= uVar13) break;
    Model::units((Model *)local_110,
                 (size_t)((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                         &local_180->super_Logger)->_M_ptr);
    local_98 = uVar13;
    Entity::id_abi_cxx11_((string *)local_1e0,(Entity *)local_110._0_8_);
    uVar15 = local_1e0._8_8_;
    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
      operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar15 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar4 = ImportedEntity::isImport((ImportedEntity *)(local_110._0_8_ + 0x10));
      if (bVar4) {
        NamedEntity::name_abi_cxx11_(&local_138,(NamedEntity *)local_110._0_8_);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x2a9333);
        local_158 = &local_148;
        plVar10 = plVar5 + 2;
        if ((long *)*plVar5 == plVar10) {
          local_148 = *plVar10;
          lStack_140 = plVar5[3];
        }
        else {
          local_148 = *plVar10;
          local_158 = (long *)*plVar5;
        }
        local_150 = plVar5[1];
        *plVar5 = (long)plVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        pEVar8 = (Entity *)(plVar5 + 2);
        if ((Entity *)*plVar5 == pEVar8) {
          local_1a0.field_2._M_allocated_capacity = (size_type)pEVar8->_vptr_Entity;
          local_1a0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_1a0.field_2._M_allocated_capacity = (size_type)pEVar8->_vptr_Entity;
          local_1a0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1a0._M_string_length = plVar5[1];
        *plVar5 = (long)pEVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        NamedEntity::name_abi_cxx11_
                  (&local_178,
                   (NamedEntity *)
                   ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_180->super_Logger)->_M_ptr);
        uVar15 = (_func_int **)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          uVar15 = local_1a0.field_2._M_allocated_capacity;
        }
        pp_Var3 = (_func_int **)
                  ((long)(_func_int ***)local_1a0._M_string_length + local_178._M_string_length);
        if ((ulong)uVar15 < pp_Var3) {
          uVar15 = (_func_int **)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != paVar16) {
            uVar15 = local_178.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < pp_Var3) goto LAB_0027bab5;
          plVar5 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_178,0,(char *)0x0,
                                      (ulong)local_1a0._M_dataplus._M_p);
        }
        else {
LAB_0027bab5:
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_1a0,(ulong)local_178._M_dataplus._M_p);
        }
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        pEVar8 = (Entity *)(plVar5 + 2);
        if ((Entity *)*plVar5 == pEVar8) {
          local_1c0.field_2._M_allocated_capacity = (size_type)pEVar8->_vptr_Entity;
          local_1c0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_1c0.field_2._M_allocated_capacity = (size_type)pEVar8->_vptr_Entity;
          local_1c0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1c0._M_string_length = plVar5[1];
        *plVar5 = (long)pEVar8;
        plVar5[1] = 0;
        *(undefined1 *)&pEVar8->_vptr_Entity = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_1c0);
      }
      else {
        NamedEntity::name_abi_cxx11_(&local_138,(NamedEntity *)local_110._0_8_);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x2a9354);
        local_158 = &local_148;
        plVar5 = puVar7 + 2;
        if ((long *)*puVar7 == plVar5) {
          local_148 = *plVar5;
          lStack_140 = puVar7[3];
        }
        else {
          local_148 = *plVar5;
          local_158 = (long *)*puVar7;
        }
        local_150 = puVar7[1];
        *puVar7 = plVar5;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        pEVar8 = (Entity *)(plVar5 + 2);
        if ((Entity *)*plVar5 == pEVar8) {
          local_1a0.field_2._M_allocated_capacity = (size_type)pEVar8->_vptr_Entity;
          local_1a0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_1a0.field_2._M_allocated_capacity = (size_type)pEVar8->_vptr_Entity;
          local_1a0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1a0._M_string_length = plVar5[1];
        *plVar5 = (long)pEVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        NamedEntity::name_abi_cxx11_
                  (&local_178,
                   (NamedEntity *)
                   ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_180->super_Logger)->_M_ptr);
        uVar15 = (_func_int **)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          uVar15 = local_1a0.field_2._M_allocated_capacity;
        }
        pp_Var3 = (_func_int **)
                  ((long)(_func_int ***)local_1a0._M_string_length + local_178._M_string_length);
        if ((ulong)uVar15 < pp_Var3) {
          uVar15 = (_func_int **)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != paVar16) {
            uVar15 = local_178.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < pp_Var3) goto LAB_0027bb3c;
          plVar5 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_178,0,(char *)0x0,
                                      (ulong)local_1a0._M_dataplus._M_p);
        }
        else {
LAB_0027bb3c:
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_1a0,(ulong)local_178._M_dataplus._M_p);
        }
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        pEVar8 = (Entity *)(plVar5 + 2);
        if ((Entity *)*plVar5 == pEVar8) {
          local_1c0.field_2._M_allocated_capacity = (size_type)pEVar8->_vptr_Entity;
          local_1c0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_1c0.field_2._M_allocated_capacity = (size_type)pEVar8->_vptr_Entity;
          local_1c0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1c0._M_string_length = plVar5[1];
        *plVar5 = (long)pEVar8;
        plVar5[1] = 0;
        *(undefined1 *)&pEVar8->_vptr_Entity = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_1c0);
      }
      puVar9 = (ulong *)(local_1e0 + 0x10);
      puVar11 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar11) {
        local_1e0._16_8_ = *puVar11;
        local_1e0._24_8_ = plVar5[3];
        local_1e0._0_8_ = puVar9;
      }
      else {
        local_1e0._16_8_ = *puVar11;
        local_1e0._0_8_ = (ulong *)*plVar5;
      }
      local_1e0._8_8_ = plVar5[1];
      *plVar5 = (long)puVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::operator=((string *)(local_110 + 0x10),(string *)local_1e0);
      if ((ulong *)local_1e0._0_8_ != puVar9) {
        operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != paVar16) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if (local_158 != &local_148) {
        operator_delete(local_158,local_148 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      pVVar14 = (ValidatorImpl *)local_1e0;
      Entity::id_abi_cxx11_((string *)local_1e0,(Entity *)local_110._0_8_);
      addIdMapItem(pVVar14,(string *)local_1e0,(string *)(local_110 + 0x10),local_118);
      if ((ulong *)local_1e0._0_8_ != puVar9) {
        operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
      }
    }
    uVar13 = 0;
    while( true ) {
      sVar6 = Units::unitCount((Units *)local_110._0_8_);
      if (sVar6 <= uVar13) break;
      local_1e0._0_8_ = local_1e0 + 0x10;
      local_1e0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1e0._16_8_ = local_1e0._16_8_ & 0xffffffffffffff00;
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      local_1c0._M_string_length = 0;
      local_1c0.field_2._M_allocated_capacity =
           local_1c0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      local_1a0._M_string_length = 0;
      local_1a0.field_2._M_allocated_capacity =
           local_1a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      Units::unitAttributes
                ((Units *)local_110._0_8_,uVar13,(string *)local_1e0,&local_1c0,&local_68,&local_70,
                 &local_1a0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        NamedEntity::name_abi_cxx11_(&local_90,(NamedEntity *)local_110._0_8_);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x2a935f);
        peVar12 = (element_type *)(plVar5 + 2);
        if ((element_type *)*plVar5 == peVar12) {
          local_d0._vptr_Issue = peVar12->_vptr_Issue;
          local_d0.mPimpl = (IssueImpl *)plVar5[3];
          local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_d0;
        }
        else {
          local_d0._vptr_Issue = peVar12->_vptr_Issue;
          local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*plVar5;
        }
        local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
        *plVar5 = (long)peVar12;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
        puVar11 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_178.field_2._M_allocated_capacity = *puVar11;
          local_178.field_2._8_8_ = plVar5[3];
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        }
        else {
          local_178.field_2._M_allocated_capacity = *puVar11;
          local_178._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_178._M_string_length = plVar5[1];
        *plVar5 = (long)puVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        NamedEntity::name_abi_cxx11_
                  (&local_c0,
                   (NamedEntity *)
                   ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_180->super_Logger)->_M_ptr);
        uVar15 = (_func_int **)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          uVar15 = local_178.field_2._M_allocated_capacity;
        }
        pp_Var3 = (_func_int **)(local_c0._M_string_length + local_178._M_string_length);
        if ((ulong)uVar15 < pp_Var3) {
          uVar15 = (_func_int **)0xf;
          if ((element_type *)local_c0._M_dataplus._M_p != (element_type *)&local_c0.field_2) {
            uVar15 = local_c0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < pp_Var3) goto LAB_0027bf2f;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_c0,0,(char *)0x0,(ulong)local_178._M_dataplus._M_p);
        }
        else {
LAB_0027bf2f:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_178,(ulong)local_c0._M_dataplus._M_p);
        }
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        psVar2 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar2) {
          local_138.field_2._M_allocated_capacity = *psVar2;
          local_138.field_2._8_8_ = puVar7[3];
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar2;
          local_138._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_138._M_string_length = puVar7[1];
        *puVar7 = psVar2;
        puVar7[1] = 0;
        *(undefined1 *)psVar2 = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
        plVar5 = puVar7 + 2;
        if ((long *)*puVar7 == plVar5) {
          local_148 = *plVar5;
          lStack_140 = puVar7[3];
          local_158 = &local_148;
        }
        else {
          local_148 = *plVar5;
          local_158 = (long *)*puVar7;
        }
        local_150 = puVar7[1];
        *puVar7 = plVar5;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)(local_110 + 0x10),(string *)&local_158);
        if (local_158 != &local_148) {
          operator_delete(local_158,local_148 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((element_type *)local_c0._M_dataplus._M_p != (element_type *)&local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if (local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            &local_d0) {
          operator_delete(local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,(long)local_d0._vptr_Issue + 1);
        }
        this_01._M_p = local_90._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        addIdMapItem((ValidatorImpl *)this_01._M_p,&local_1a0,(string *)(local_110 + 0x10),local_118
                    );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
        operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
      }
      uVar13 = uVar13 + 1;
    }
    ImportedEntity::importSource((ImportedEntity *)(local_110._0_8_ + 0x10));
    if ((Entity *)local_1c0._M_dataplus._M_p == (Entity *)0x0) {
      bVar4 = false;
    }
    else {
      ImportedEntity::importSource((ImportedEntity *)(local_110._0_8_ + 0x10));
      Entity::id_abi_cxx11_((string *)local_1e0,(Entity *)local_1a0._M_dataplus._M_p);
      bVar4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
        operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._M_string_length);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._M_string_length);
    }
    puVar11 = (ulong *)(local_1e0 + 0x10);
    if (bVar4) {
      NamedEntity::name_abi_cxx11_(&local_1a0,(NamedEntity *)local_110._0_8_);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x2a9372);
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      pEVar8 = (Entity *)(plVar5 + 2);
      if ((Entity *)*plVar5 == pEVar8) {
        local_1c0.field_2._M_allocated_capacity = (size_type)pEVar8->_vptr_Entity;
        local_1c0.field_2._8_8_ = plVar5[3];
      }
      else {
        local_1c0.field_2._M_allocated_capacity = (size_type)pEVar8->_vptr_Entity;
        local_1c0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_1c0._M_string_length = plVar5[1];
      *plVar5 = (long)pEVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_1c0);
      puVar9 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar9) {
        local_1e0._16_8_ = *puVar9;
        local_1e0._24_8_ = plVar5[3];
        local_1e0._0_8_ = puVar11;
      }
      else {
        local_1e0._16_8_ = *puVar9;
        local_1e0._0_8_ = (ulong *)*plVar5;
      }
      local_1e0._8_8_ = plVar5[1];
      *plVar5 = (long)puVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::operator=((string *)(local_110 + 0x10),(string *)local_1e0);
      if ((ulong *)local_1e0._0_8_ != puVar11) {
        operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      ImportedEntity::importSource((ImportedEntity *)(local_110._0_8_ + 0x10));
      pVVar14 = (ValidatorImpl *)local_1e0;
      Entity::id_abi_cxx11_((string *)local_1e0,(Entity *)local_1c0._M_dataplus._M_p);
      addIdMapItem(pVVar14,(string *)local_1e0,(string *)(local_110 + 0x10),local_118);
      if ((ulong *)local_1e0._0_8_ != puVar11) {
        operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._M_string_length);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
    }
    uVar13 = local_98 + 1;
  }
  ComponentEntity::encapsulationId_abi_cxx11_
            ((string *)local_1e0,
             &((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
              &local_180->super_Logger)->_M_ptr->super_ComponentEntity);
  pVVar14 = local_a0;
  uVar15 = local_1e0._8_8_;
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar15 ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0027c8c7;
  ComponentEntity::encapsulationId_abi_cxx11_
            ((string *)local_1e0,
             &((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
              &local_180->super_Logger)->_M_ptr->super_ComponentEntity);
  bVar4 = isValidXmlName((string *)local_1e0);
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if (!bVar4) {
    Issue::IssueImpl::create();
    Issue::IssueImpl::setReferenceRule
              ((local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,XML_ID_ATTRIBUTE);
    AnyCellmlElement::AnyCellmlElementImpl::setModel
              ((((local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,(ModelPtr *)local_180,MODEL);
    this_00 = (local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              mPimpl;
    NamedEntity::name_abi_cxx11_
              (&local_138,
               (NamedEntity *)
               ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
               &local_180->super_Logger)->_M_ptr);
    puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x2a6479);
    plVar5 = puVar7 + 2;
    if ((long *)*puVar7 == plVar5) {
      local_148 = *plVar5;
      lStack_140 = puVar7[3];
      local_158 = &local_148;
    }
    else {
      local_148 = *plVar5;
      local_158 = (long *)*puVar7;
    }
    local_150 = puVar7[1];
    *puVar7 = plVar5;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    pEVar8 = (Entity *)(plVar5 + 2);
    if ((Entity *)*plVar5 == pEVar8) {
      local_1a0.field_2._M_allocated_capacity = (size_type)pEVar8->_vptr_Entity;
      local_1a0.field_2._8_8_ = plVar5[3];
    }
    else {
      local_1a0.field_2._M_allocated_capacity = (size_type)pEVar8->_vptr_Entity;
      local_1a0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_1a0._M_string_length = plVar5[1];
    *plVar5 = (long)pEVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    ComponentEntity::encapsulationId_abi_cxx11_
              (&local_178,
               &((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                &local_180->super_Logger)->_M_ptr->super_ComponentEntity);
    pp_Var3 = (_func_int **)
              ((long)(_func_int ***)local_1a0._M_string_length + local_178._M_string_length);
    uVar15 = (_func_int **)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      uVar15 = local_1a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < pp_Var3) {
      uVar15 = (_func_int **)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != paVar16) {
        uVar15 = local_178.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < pp_Var3) goto LAB_0027c5c2;
      plVar5 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_178,0,(char *)0x0,(ulong)local_1a0._M_dataplus._M_p)
      ;
    }
    else {
LAB_0027c5c2:
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1a0,(ulong)local_178._M_dataplus._M_p);
    }
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    pEVar8 = (Entity *)(plVar5 + 2);
    if ((Entity *)*plVar5 == pEVar8) {
      local_1c0.field_2._M_allocated_capacity = (size_type)pEVar8->_vptr_Entity;
      local_1c0.field_2._8_8_ = plVar5[3];
    }
    else {
      local_1c0.field_2._M_allocated_capacity = (size_type)pEVar8->_vptr_Entity;
      local_1c0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_1c0._M_string_length = plVar5[1];
    *plVar5 = (long)pEVar8;
    plVar5[1] = 0;
    *(undefined1 *)&pEVar8->_vptr_Entity = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_1c0);
    local_1e0._0_8_ = local_1e0 + 0x10;
    puVar11 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar11) {
      local_1e0._16_8_ = *puVar11;
      local_1e0._24_8_ = plVar5[3];
    }
    else {
      local_1e0._16_8_ = *puVar11;
      local_1e0._0_8_ = (ulong *)*plVar5;
    }
    local_1e0._8_8_ = plVar5[1];
    *plVar5 = (long)puVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Issue::IssueImpl::setDescription(this_00,(string *)local_1e0);
    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
      operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar16) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    Logger::LoggerImpl::addIssue(&pVVar14->super_LoggerImpl,&local_e0);
    if (local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  puVar11 = (ulong *)(local_1e0 + 0x10);
  NamedEntity::name_abi_cxx11_
            (&local_1a0,
             (NamedEntity *)
             ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)&local_180->super_Logger
             )->_M_ptr);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x2a93c7);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  pEVar8 = (Entity *)(plVar5 + 2);
  if ((Entity *)*plVar5 == pEVar8) {
    local_1c0.field_2._M_allocated_capacity = (size_type)pEVar8->_vptr_Entity;
    local_1c0.field_2._8_8_ = plVar5[3];
  }
  else {
    local_1c0.field_2._M_allocated_capacity = (size_type)pEVar8->_vptr_Entity;
    local_1c0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1c0._M_string_length = plVar5[1];
  *plVar5 = (long)pEVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_1e0._16_8_ = *puVar9;
    local_1e0._24_8_ = plVar5[3];
    local_1e0._0_8_ = puVar11;
  }
  else {
    local_1e0._16_8_ = *puVar9;
    local_1e0._0_8_ = (ulong *)*plVar5;
  }
  local_1e0._8_8_ = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::operator=((string *)(local_110 + 0x10),(string *)local_1e0);
  if ((ulong *)local_1e0._0_8_ != puVar11) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  this_02 = (ValidatorImpl *)local_1e0;
  ComponentEntity::encapsulationId_abi_cxx11_
            ((string *)this_02,
             &((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
              &local_180->super_Logger)->_M_ptr->super_ComponentEntity);
  addIdMapItem(this_02,(string *)local_1e0,(string *)(local_110 + 0x10),local_118);
  if ((ulong *)local_1e0._0_8_ != puVar11) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
  }
LAB_0027c8c7:
  uVar13 = 0;
  while( true ) {
    sVar6 = ComponentEntity::componentCount
                      (&((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                        &local_180->super_Logger)->_M_ptr->super_ComponentEntity);
    if (sVar6 <= uVar13) break;
    ComponentEntity::component
              ((ComponentEntity *)local_1e0,
               (size_t)((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                       &local_180->super_Logger)->_M_ptr);
    buildComponentIdMap(pVVar14,(ComponentPtr *)local_1e0,local_118,
                        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_60);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_);
    }
    uVar13 = uVar13 + 1;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  if ((element_type *)local_100._0_8_ != (element_type *)(local_100 + 0x10)) {
    operator_delete((void *)local_100._0_8_,CONCAT71(uStack_ef,local_100[0x10]) + 1);
  }
  return local_118;
}

Assistant:

IdMap Validator::ValidatorImpl::buildModelIdMap(const ModelPtr &model)
{
    IdMap idMap;
    std::string info;
    std::set<std::string> reportedConnections;
    // Model.
    if (!model->id().empty()) {
        info = " - model '" + model->name() + "'";
        addIdMapItem(model->id(), info, idMap);
    }

    // Units.
    for (size_t u = 0; u < model->unitsCount(); ++u) {
        auto units = model->units(u);
        if (!units->id().empty()) {
            if (units->isImport()) {
                info = " - imported units '" + units->name() + "' in model '" + model->name() + "'";
            } else {
                info = " - units '" + units->name() + "' in model '" + model->name() + "'";
            }
            addIdMapItem(units->id(), info, idMap);
        }
        for (size_t i = 0; i < units->unitCount(); ++i) {
            std::string reference;
            std::string prefix;
            double exponent;
            double multiplier;
            std::string id;
            units->unitAttributes(i, reference, prefix, exponent, multiplier, id);
            if (!id.empty()) {
                info = " - unit in units '" + units->name() + "' in model '" + model->name() + "'";
                addIdMapItem(id, info, idMap);
            }
        }
        if ((units->importSource() != nullptr) && !units->importSource()->id().empty()) {
            info = " - import source for units '" + units->name() + "'";
            addIdMapItem(units->importSource()->id(), info, idMap);
        }
    }
    // Encapsulation.
    if (!model->encapsulationId().empty()) {
        // Check for a valid identifier.
        if (!isValidXmlName(model->encapsulationId())) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
            issue->mPimpl->mItem->mPimpl->setModel(model);
            issue->mPimpl->setDescription("Model '" + model->name() + "' does not have a valid encapsulation 'id' attribute, '" + model->encapsulationId() + "'.");
            addIssue(issue);
        }

        info = " - encapsulation in model '" + model->name() + "'";
        addIdMapItem(model->encapsulationId(), info, idMap);
    }

    // Start recursion through encapsulation hierarchy.
    for (size_t c = 0; c < model->componentCount(); ++c) {
        buildComponentIdMap(model->component(c), idMap, reportedConnections);
    }
    return idMap;
}